

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O0

void __thiscall
iu_AssertionTest_x_iutest_x_ScopedTrace_Test::Body
          (iu_AssertionTest_x_iutest_x_ScopedTrace_Test *this)

{
  iuStreamMessage *piVar1;
  iuStreamMessage local_580;
  iuCodeMessage local_3f8;
  undefined1 local_3c8 [8];
  ScopedMessage scoped_message_1;
  iuStreamMessage local_388;
  iuStreamMessage local_200;
  iuCodeMessage local_78;
  undefined1 local_48 [8];
  ScopedMessage scoped_message_0;
  int x;
  iu_AssertionTest_x_iutest_x_ScopedTrace_Test *this_local;
  
  scoped_message_0.super_iuCodeMessage._44_4_ = 100;
  iutest::detail::iuStreamMessage::iuStreamMessage(&local_200);
  iutest::detail::iuStreamMessage::iuStreamMessage(&local_388);
  piVar1 = iutest::detail::iuStreamMessage::operator<<(&local_388,(char (*) [3])"x=");
  piVar1 = iutest::detail::iuStreamMessage::operator<<
                     (piVar1,(int *)&scoped_message_0.super_iuCodeMessage.field_0x2c);
  piVar1 = iutest::detail::iuStreamMessage::operator<<(&local_200,piVar1);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
             ,0x118,piVar1);
  iutest::AssertionHelper::ScopedMessage::ScopedMessage((ScopedMessage *)local_48,&local_78);
  iutest::detail::iuCodeMessage::~iuCodeMessage(&local_78);
  iutest::detail::iuStreamMessage::~iuStreamMessage(&local_388);
  iutest::detail::iuStreamMessage::~iuStreamMessage(&local_200);
  iutest::AssertionHelper::ScopedMessage::~ScopedMessage((ScopedMessage *)local_48);
  iutest::detail::iuStreamMessage::iuStreamMessage(&local_580);
  piVar1 = iutest::detail::iuStreamMessage::operator<<(&local_580,(char (*) [5])0x546722);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_3f8,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
             ,0x11b,piVar1);
  iutest::AssertionHelper::ScopedMessage::ScopedMessage((ScopedMessage *)local_3c8,&local_3f8);
  iutest::detail::iuCodeMessage::~iuCodeMessage(&local_3f8);
  iutest::detail::iuStreamMessage::~iuStreamMessage(&local_580);
  iutest::AssertionHelper::ScopedMessage::~ScopedMessage((ScopedMessage *)local_3c8);
  return;
}

Assistant:

IUTEST(AssertionTest, ScopedTrace)
{
    {
        int x=100;
        IUTEST_SCOPED_TRACE(::iutest::Message() << "x=" << x);
    }
    {
        IUTEST_SCOPED_TRACE("test");
    }
}